

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint generateFixedLitLenTree(HuffmanTree *tree)

{
  uint *bitlen_00;
  uint *bitlen;
  uint error;
  uint i;
  size_t in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  uint uVar2;
  uint local_4;
  
  uVar1 = 0;
  bitlen_00 = (uint *)lodepng_malloc(0x12362b);
  if (bitlen_00 == (uint *)0x0) {
    local_4 = 0x53;
  }
  else {
    for (uVar2 = 0; uVar2 < 0x90; uVar2 = uVar2 + 1) {
      bitlen_00[uVar2] = 8;
    }
    for (uVar2 = 0x90; uVar2 < 0x100; uVar2 = uVar2 + 1) {
      bitlen_00[uVar2] = 9;
    }
    for (uVar2 = 0x100; uVar2 < 0x118; uVar2 = uVar2 + 1) {
      bitlen_00[uVar2] = 7;
    }
    for (uVar2 = 0x118; uVar2 < 0x120; uVar2 = uVar2 + 1) {
      bitlen_00[uVar2] = 8;
    }
    local_4 = HuffmanTree_makeFromLengths
                        ((HuffmanTree *)CONCAT44(uVar2,uVar1),bitlen_00,in_stack_ffffffffffffffd8,0)
    ;
    lodepng_free((void *)0x123728);
  }
  return local_4;
}

Assistant:

static unsigned generateFixedLitLenTree(HuffmanTree* tree)
{
	unsigned i, error = 0;
	unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
	if (!bitlen) return 83; /*alloc fail*/

	/*288 possible codes: 0-255=literals, 256=endcode, 257-285=lengthcodes, 286-287=unused*/
	for (i = 0; i <= 143; ++i) bitlen[i] = 8;
	for (i = 144; i <= 255; ++i) bitlen[i] = 9;
	for (i = 256; i <= 279; ++i) bitlen[i] = 7;
	for (i = 280; i <= 287; ++i) bitlen[i] = 8;

	error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DEFLATE_CODE_SYMBOLS, 15);

	lodepng_free(bitlen);
	return error;
}